

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

real __thiscall
fasttext::Model::oneVsAll(Model *this,vector<int,_std::allocator<int>_> *targets,real lr)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  real rVar2;
  int local_24;
  real local_20;
  float local_1c;
  
  local_24 = 0;
  if (this->osz_ < 1) {
    local_1c = 0.0;
  }
  else {
    local_1c = 0.0;
    local_20 = lr;
    do {
      _Var1 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        ((targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,&local_24);
      rVar2 = binaryLogistic(this,local_24,
                             _Var1._M_current !=
                             (targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish,local_20);
      local_1c = local_1c + rVar2;
      local_24 = local_24 + 1;
    } while (local_24 < this->osz_);
  }
  return local_1c;
}

Assistant:

real Model::oneVsAll(const std::vector<int32_t>& targets, real lr) {
	real loss = 0.0;
	for (int32_t i = 0; i < osz_; i++) {
		bool isMatch = utils::contains(targets, i);
		loss += binaryLogistic(i, isMatch, lr);
	}

	return loss;
}